

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hybrid_fwd_txfm.c
# Opt level: O3

void av1_highbd_fwd_txfm(int16_t *src_diff,tran_low_t *coeff,int diff_stride,TxfmParam *txfm_param)

{
  TX_TYPE TVar1;
  _func_void_int16_t_ptr_int32_t_ptr_int_TX_TYPE_int **pp_Var2;
  int bd;
  int iVar3;
  
  switch(txfm_param->tx_size) {
  case '\0':
    if (txfm_param->lossless == 0) {
      (*av1_fwd_txfm2d_4x4)(src_diff,coeff,diff_stride,txfm_param->tx_type,txfm_param->bd);
      return;
    }
    (*av1_fwht4x4)(src_diff,coeff,diff_stride);
    return;
  case '\x01':
    TVar1 = txfm_param->tx_type;
    iVar3 = txfm_param->bd;
    pp_Var2 = &av1_fwd_txfm2d_8x8;
    break;
  case '\x02':
    TVar1 = txfm_param->tx_type;
    iVar3 = txfm_param->bd;
    pp_Var2 = &av1_fwd_txfm2d_16x16;
    break;
  case '\x03':
    TVar1 = txfm_param->tx_type;
    iVar3 = txfm_param->bd;
    pp_Var2 = &av1_fwd_txfm2d_32x32;
    break;
  case '\x04':
    iVar3 = txfm_param->bd;
    pp_Var2 = &av1_fwd_txfm2d_64x64;
    goto LAB_001cfc9d;
  case '\x05':
    TVar1 = txfm_param->tx_type;
    iVar3 = txfm_param->bd;
    pp_Var2 = &av1_fwd_txfm2d_4x8;
    break;
  case '\x06':
    TVar1 = txfm_param->tx_type;
    iVar3 = txfm_param->bd;
    pp_Var2 = &av1_fwd_txfm2d_8x4;
    break;
  case '\a':
    TVar1 = txfm_param->tx_type;
    iVar3 = txfm_param->bd;
    pp_Var2 = &av1_fwd_txfm2d_8x16;
    break;
  case '\b':
    TVar1 = txfm_param->tx_type;
    iVar3 = txfm_param->bd;
    pp_Var2 = &av1_fwd_txfm2d_16x8;
    break;
  case '\t':
    TVar1 = txfm_param->tx_type;
    iVar3 = txfm_param->bd;
    pp_Var2 = &av1_fwd_txfm2d_16x32;
    break;
  case '\n':
    TVar1 = txfm_param->tx_type;
    iVar3 = txfm_param->bd;
    pp_Var2 = &av1_fwd_txfm2d_32x16;
    break;
  case '\v':
    TVar1 = txfm_param->tx_type;
    iVar3 = txfm_param->bd;
    pp_Var2 = &av1_fwd_txfm2d_32x64;
    break;
  case '\f':
    TVar1 = txfm_param->tx_type;
    iVar3 = txfm_param->bd;
    pp_Var2 = &av1_fwd_txfm2d_64x32;
    break;
  case '\r':
    TVar1 = txfm_param->tx_type;
    iVar3 = txfm_param->bd;
    pp_Var2 = &av1_fwd_txfm2d_4x16;
    break;
  case '\x0e':
    TVar1 = txfm_param->tx_type;
    iVar3 = txfm_param->bd;
    pp_Var2 = &av1_fwd_txfm2d_16x4;
    break;
  case '\x0f':
    TVar1 = txfm_param->tx_type;
    iVar3 = txfm_param->bd;
    pp_Var2 = &av1_fwd_txfm2d_8x32;
    break;
  case '\x10':
    TVar1 = txfm_param->tx_type;
    iVar3 = txfm_param->bd;
    pp_Var2 = &av1_fwd_txfm2d_32x8;
    break;
  case '\x11':
    iVar3 = txfm_param->bd;
    pp_Var2 = &av1_fwd_txfm2d_16x64;
    goto LAB_001cfc9d;
  case '\x12':
    iVar3 = txfm_param->bd;
    pp_Var2 = &av1_fwd_txfm2d_64x16;
LAB_001cfc9d:
    (**pp_Var2)(src_diff,coeff,diff_stride,'\0',iVar3);
    return;
  default:
    return;
  }
  (**pp_Var2)(src_diff,coeff,diff_stride,TVar1,iVar3);
  return;
}

Assistant:

void av1_highbd_fwd_txfm(const int16_t *src_diff, tran_low_t *coeff,
                         int diff_stride, TxfmParam *txfm_param) {
  assert(av1_ext_tx_used[txfm_param->tx_set_type][txfm_param->tx_type]);
  const TX_SIZE tx_size = txfm_param->tx_size;
  switch (tx_size) {
    case TX_64X64:
      highbd_fwd_txfm_64x64(src_diff, coeff, diff_stride, txfm_param);
      break;
    case TX_32X64:
      highbd_fwd_txfm_32x64(src_diff, coeff, diff_stride, txfm_param);
      break;
    case TX_64X32:
      highbd_fwd_txfm_64x32(src_diff, coeff, diff_stride, txfm_param);
      break;

    case TX_32X32:
      highbd_fwd_txfm_32x32(src_diff, coeff, diff_stride, txfm_param);
      break;
    case TX_16X16:
      highbd_fwd_txfm_16x16(src_diff, coeff, diff_stride, txfm_param);
      break;
    case TX_8X8:
      highbd_fwd_txfm_8x8(src_diff, coeff, diff_stride, txfm_param);
      break;
    case TX_4X8:
      highbd_fwd_txfm_4x8(src_diff, coeff, diff_stride, txfm_param);
      break;
    case TX_8X4:
      highbd_fwd_txfm_8x4(src_diff, coeff, diff_stride, txfm_param);
      break;
    case TX_8X16:
      highbd_fwd_txfm_8x16(src_diff, coeff, diff_stride, txfm_param);
      break;
    case TX_16X8:
      highbd_fwd_txfm_16x8(src_diff, coeff, diff_stride, txfm_param);
      break;
    case TX_16X32:
      highbd_fwd_txfm_16x32(src_diff, coeff, diff_stride, txfm_param);
      break;
    case TX_32X16:
      highbd_fwd_txfm_32x16(src_diff, coeff, diff_stride, txfm_param);
      break;
    case TX_4X4:
      highbd_fwd_txfm_4x4(src_diff, coeff, diff_stride, txfm_param);
      break;
#if !CONFIG_REALTIME_ONLY
    case TX_4X16:
      highbd_fwd_txfm_4x16(src_diff, coeff, diff_stride, txfm_param);
      break;
    case TX_16X4:
      highbd_fwd_txfm_16x4(src_diff, coeff, diff_stride, txfm_param);
      break;
    case TX_8X32:
      highbd_fwd_txfm_8x32(src_diff, coeff, diff_stride, txfm_param);
      break;
    case TX_32X8:
      highbd_fwd_txfm_32x8(src_diff, coeff, diff_stride, txfm_param);
      break;
    case TX_16X64:
      highbd_fwd_txfm_16x64(src_diff, coeff, diff_stride, txfm_param);
      break;
    case TX_64X16:
      highbd_fwd_txfm_64x16(src_diff, coeff, diff_stride, txfm_param);
      break;
#endif
    default: assert(0); break;
  }
}